

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwapFields
          (Reflection *this,Message *lhs,Message *rhs,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  Arena **v1;
  Arena **v2;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_58 [23];
  Voidify local_41;
  Arena *local_40;
  Arena *local_38;
  string *local_30;
  string *absl_log_internal_check_op_result;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  absl_log_internal_check_op_result = (string *)fields;
  fields_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)this;
  local_38 = MessageLite::GetArena(&lhs->super_MessageLite);
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&local_38);
  local_40 = MessageLite::GetArena((MessageLite *)fields_local);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&local_40);
  local_30 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                       (v1,v2,"lhs->GetArena() == rhs->GetArena()");
  if (local_30 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x4c1,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
  }
  UnsafeShallowSwapFields
            (this,rhs_local,(Message *)fields_local,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)absl_log_internal_check_op_result);
  return;
}

Assistant:

void Reflection::UnsafeArenaSwapFields(
    Message* lhs, Message* rhs,
    const std::vector<const FieldDescriptor*>& fields) const {
  ABSL_DCHECK_EQ(lhs->GetArena(), rhs->GetArena());
  UnsafeShallowSwapFields(lhs, rhs, fields);
}